

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc.c
# Opt level: O3

int qcc_main(int argc,char **argv,qcc_main_fn main_fn)

{
  void *buffer;
  qcc_arena arena;
  qcc_engine eng;
  qcc_arena qStack_e8;
  qcc_engine local_b8;
  
  buffer = malloc(0x400000);
  qcc_arena_init(&qStack_e8,buffer,0x400000);
  qcc_engine_init(&local_b8,&qStack_e8);
  (*main_fn)(&local_b8);
  qcc_logger_dump(&local_b8.logger,"%s\n");
  printf("Summary: %u total tests run, %u tests failed\n",(ulong)local_b8.total_tests,
         (ulong)local_b8.failed_tests);
  qcc_arena_done(&qStack_e8);
  free(buffer);
  return local_b8.failed_tests;
}

Assistant:

int qcc_main(int argc, const char *argv[], qcc_main_fn main_fn)
{
    (void)argc;
    (void)argv;

    const size_t arena_size = 4 * 1024 * 1024;
    char *arena_data = (char *)malloc(arena_size);

    struct qcc_arena arena;
    qcc_arena_init(&arena, arena_data, arena_size);

    struct qcc_engine eng;
    qcc_engine_init(&eng, &arena);

    main_fn(&eng);

    qcc_logger_dump(&eng.logger, "%s\n");
    printf("Summary: %u total tests run, %u tests failed\n", eng.total_tests,
           eng.failed_tests);

    qcc_arena_done(&arena);
    free(arena_data);

    return eng.failed_tests;
}